

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

aiMaterial *
ImportMaterial(vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *r,Material *mat)

{
  ulong uVar1;
  aiMaterial *this;
  size_t sVar2;
  float glossinessAsShininess;
  float local_438;
  aiString alphaMode;
  
  this = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this);
  uVar1 = (mat->super_Object).name._M_string_length;
  if (uVar1 != 0) {
    sVar2 = 0x3ff;
    if ((uVar1 & 0xfffffc00) == 0) {
      sVar2 = uVar1 & 0xffffffff;
    }
    alphaMode.length = (ai_uint32)sVar2;
    memcpy(alphaMode.data,(mat->super_Object).name._M_dataplus._M_p,sVar2);
    alphaMode.data[sVar2] = '\0';
    aiMaterial::AddProperty(this,&alphaMode,"?mat.name",0,0);
  }
  SetMaterialColorProperty(r,(mat->pbrMetallicRoughness).baseColorFactor,this,"$clr.diffuse",0,0);
  SetMaterialColorProperty
            (r,(mat->pbrMetallicRoughness).baseColorFactor,this,
             "$mat.gltf.pbrMetallicRoughness.baseColorFactor",0,0);
  SetMaterialTextureProperty
            (embeddedTexIdxs,r,(mat->pbrMetallicRoughness).baseColorTexture,this,
             aiTextureType_DIFFUSE,0);
  SetMaterialTextureProperty
            (embeddedTexIdxs,r,(mat->pbrMetallicRoughness).baseColorTexture,this,
             aiTextureType_DIFFUSE,1);
  SetMaterialTextureProperty
            (embeddedTexIdxs,r,(mat->pbrMetallicRoughness).metallicRoughnessTexture,this,
             aiTextureType_UNKNOWN,0);
  aiMaterial::AddProperty
            (this,&(mat->pbrMetallicRoughness).metallicFactor,1,
             "$mat.gltf.pbrMetallicRoughness.metallicFactor",0,0);
  aiMaterial::AddProperty
            (this,&(mat->pbrMetallicRoughness).roughnessFactor,1,
             "$mat.gltf.pbrMetallicRoughness.roughnessFactor",0,0);
  local_438 = 1.0 - (mat->pbrMetallicRoughness).roughnessFactor;
  local_438 = local_438 * 1000.0 * local_438;
  aiMaterial::AddProperty(this,&local_438,1,"$mat.shininess",0,0);
  SetMaterialTextureProperty(embeddedTexIdxs,r,&mat->normalTexture,this,aiTextureType_NORMALS,0);
  SetMaterialTextureProperty(embeddedTexIdxs,r,&mat->occlusionTexture,this,aiTextureType_LIGHTMAP,0)
  ;
  SetMaterialTextureProperty(embeddedTexIdxs,r,mat->emissiveTexture,this,aiTextureType_EMISSIVE,0);
  SetMaterialColorProperty(r,&mat->emissiveFactor,this,"$clr.emissive",0,0);
  aiMaterial::AddProperty<bool>(this,&mat->doubleSided,1,"$mat.twosided",0,0);
  uVar1 = (mat->alphaMode)._M_string_length;
  sVar2 = 0x3ff;
  if ((uVar1 & 0xfffffc00) == 0) {
    sVar2 = uVar1 & 0xffffffff;
  }
  alphaMode.length = (ai_uint32)sVar2;
  memcpy(alphaMode.data,(mat->alphaMode)._M_dataplus._M_p,sVar2);
  alphaMode.data[sVar2] = '\0';
  aiMaterial::AddProperty(this,&alphaMode,"$mat.gltf.alphaMode",0,0);
  aiMaterial::AddProperty(this,&mat->alphaCutoff,1,"$mat.gltf.alphaCutoff",0,0);
  if ((mat->pbrSpecularGlossiness).isPresent == true) {
    aiMaterial::AddProperty<bool>
              (this,&(mat->pbrSpecularGlossiness).isPresent,1,"$mat.gltf.pbrSpecularGlossiness",0,0)
    ;
    SetMaterialColorProperty(r,(vec4 *)&mat->pbrSpecularGlossiness,this,"$clr.diffuse",0,0);
    SetMaterialColorProperty
              (r,&(mat->pbrSpecularGlossiness).value.specularFactor,this,"$clr.specular",0,0);
    glossinessAsShininess = (mat->pbrSpecularGlossiness).value.glossinessFactor * 1000.0;
    aiMaterial::AddProperty(this,&glossinessAsShininess,1,"$mat.shininess",0,0);
    aiMaterial::AddProperty
              (this,&(mat->pbrSpecularGlossiness).value.glossinessFactor,1,
               "$mat.gltf.pbrMetallicRoughness.glossinessFactor",0,0);
    SetMaterialTextureProperty
              (embeddedTexIdxs,r,(mat->pbrSpecularGlossiness).value.diffuseTexture,this,
               aiTextureType_DIFFUSE,0);
    SetMaterialTextureProperty
              (embeddedTexIdxs,r,(mat->pbrSpecularGlossiness).value.specularGlossinessTexture,this,
               aiTextureType_SPECULAR,0);
  }
  if (mat->unlit == true) {
    aiMaterial::AddProperty<bool>(this,&mat->unlit,1,"$mat.gltf.unlit",0,0);
  }
  return this;
}

Assistant:

static aiMaterial* ImportMaterial(std::vector<int>& embeddedTexIdxs, Asset& r, Material& mat)
{
    aiMaterial* aimat = new aiMaterial();

   if (!mat.name.empty()) {
        aiString str(mat.name);

        aimat->AddProperty(&str, AI_MATKEY_NAME);
    }

    SetMaterialColorProperty(r, mat.pbrMetallicRoughness.baseColorFactor, aimat, AI_MATKEY_COLOR_DIFFUSE);
    SetMaterialColorProperty(r, mat.pbrMetallicRoughness.baseColorFactor, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_BASE_COLOR_FACTOR);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.baseColorTexture, aimat, aiTextureType_DIFFUSE);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.baseColorTexture, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_BASE_COLOR_TEXTURE);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.pbrMetallicRoughness.metallicRoughnessTexture, aimat, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_METALLICROUGHNESS_TEXTURE);

    aimat->AddProperty(&mat.pbrMetallicRoughness.metallicFactor, 1, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_METALLIC_FACTOR);
    aimat->AddProperty(&mat.pbrMetallicRoughness.roughnessFactor, 1, AI_MATKEY_GLTF_PBRMETALLICROUGHNESS_ROUGHNESS_FACTOR);

    float roughnessAsShininess = 1 - mat.pbrMetallicRoughness.roughnessFactor;
    roughnessAsShininess *= roughnessAsShininess * 1000;
    aimat->AddProperty(&roughnessAsShininess, 1, AI_MATKEY_SHININESS);

    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.normalTexture, aimat, aiTextureType_NORMALS);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.occlusionTexture, aimat, aiTextureType_LIGHTMAP);
    SetMaterialTextureProperty(embeddedTexIdxs, r, mat.emissiveTexture, aimat, aiTextureType_EMISSIVE);
    SetMaterialColorProperty(r, mat.emissiveFactor, aimat, AI_MATKEY_COLOR_EMISSIVE);

    aimat->AddProperty(&mat.doubleSided, 1, AI_MATKEY_TWOSIDED);

    aiString alphaMode(mat.alphaMode);
    aimat->AddProperty(&alphaMode, AI_MATKEY_GLTF_ALPHAMODE);
    aimat->AddProperty(&mat.alphaCutoff, 1, AI_MATKEY_GLTF_ALPHACUTOFF);

    //pbrSpecularGlossiness
    if (mat.pbrSpecularGlossiness.isPresent) {
        PbrSpecularGlossiness &pbrSG = mat.pbrSpecularGlossiness.value;

        aimat->AddProperty(&mat.pbrSpecularGlossiness.isPresent, 1, AI_MATKEY_GLTF_PBRSPECULARGLOSSINESS);
        SetMaterialColorProperty(r, pbrSG.diffuseFactor, aimat, AI_MATKEY_COLOR_DIFFUSE);
        SetMaterialColorProperty(r, pbrSG.specularFactor, aimat, AI_MATKEY_COLOR_SPECULAR);

        float glossinessAsShininess = pbrSG.glossinessFactor * 1000.0f;
        aimat->AddProperty(&glossinessAsShininess, 1, AI_MATKEY_SHININESS);
        aimat->AddProperty(&pbrSG.glossinessFactor, 1, AI_MATKEY_GLTF_PBRSPECULARGLOSSINESS_GLOSSINESS_FACTOR);

        SetMaterialTextureProperty(embeddedTexIdxs, r, pbrSG.diffuseTexture, aimat, aiTextureType_DIFFUSE);

        SetMaterialTextureProperty(embeddedTexIdxs, r, pbrSG.specularGlossinessTexture, aimat, aiTextureType_SPECULAR);
    }
    if (mat.unlit) {
        aimat->AddProperty(&mat.unlit, 1, AI_MATKEY_GLTF_UNLIT);
    }

    return aimat;
}